

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

int __thiscall
JsUtil::
BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
          (BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,PolymorphicInlineCache **key,InlineCacheData **value)

{
  BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *pBVar1;
  char *pcVar2;
  PolymorphicInlineCache *pPVar3;
  InlineCacheData *pIVar4;
  long lVar5;
  code *pcVar6;
  long lVar7;
  bool bVar8;
  int iVar9;
  undefined4 *puVar10;
  long lVar11;
  uint uVar12;
  char *addr;
  uint uVar13;
  int iVar14;
  uint hashCode;
  InlineCacheData *local_68;
  long local_60;
  BaseDictionary<Js::PolymorphicInlineCache_const*,InlineCacheData*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  *local_58;
  long local_50;
  PolymorphicInlineCache *local_48;
  InlineCacheData **local_40;
  uint local_34;
  
  lVar11 = *(long *)this;
  local_40 = value;
  if (lVar11 == 0) {
    BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar11 = *(long *)this;
  }
  hashCode = (uint)((ulong)*key >> 3) | 1;
  local_34 = BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar13 = *(uint *)(lVar11 + (ulong)local_34 * 4);
  if ((int)uVar13 < 0) {
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    do {
      pcVar2 = (char *)(*(long *)(this + 8) + (ulong)uVar13 * 0x18);
      if (*(PolymorphicInlineCache **)(pcVar2 + 0x10) == *key) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar12);
        }
        pPVar3 = (PolymorphicInlineCache *)*local_40;
        Memory::Recycler::WBSetBit((char *)&local_48);
        local_48 = pPVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
        pPVar3 = local_48;
        Memory::Recycler::WBSetBit(pcVar2);
        *(PolymorphicInlineCache **)pcVar2 = pPVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar2);
        return uVar13;
      }
      uVar12 = uVar12 + 1;
      uVar13 = *(uint *)(pcVar2 + 8);
    } while (-1 < (int)uVar13);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),uVar12);
  }
  if (*(int *)(this + 0x28) == 0) {
    iVar9 = *(int *)(this + 0x18);
    iVar14 = *(int *)(this + 0x20);
    if (iVar14 == iVar9) {
      BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Resize((BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)this);
      local_34 = BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
      iVar9 = *(int *)(this + 0x18);
      iVar14 = *(int *)(this + 0x20);
    }
    *(int *)(this + 0x20) = iVar14 + 1;
    if (iVar9 < iVar14 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar8) goto LAB_007a31cc;
      *puVar10 = 0;
      iVar9 = *(int *)(this + 0x18);
    }
    if (iVar9 <= iVar14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar8) goto LAB_007a31cc;
      *puVar10 = 0;
    }
  }
  else {
    if (*(int *)(this + 0x28) < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar8) goto LAB_007a31cc;
      *puVar10 = 0;
    }
    iVar14 = *(int *)(this + 0x24);
    if (iVar14 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar8) goto LAB_007a31cc;
      *puVar10 = 0;
      iVar14 = *(int *)(this + 0x24);
    }
    if (*(int *)(this + 0x20) <= iVar14) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar8) {
LAB_007a31cc:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar10 = 0;
      iVar14 = *(int *)(this + 0x24);
    }
    pBVar1 = this + 0x28;
    *(int *)pBVar1 = *(int *)pBVar1 + -1;
    if (*(int *)pBVar1 != 0) {
      iVar9 = BaseDictionary<const_Js::PolymorphicInlineCache_*,_InlineCacheData_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((EntryType *)((long)iVar14 * 0x18 + *(long *)(this + 8)));
      *(int *)(this + 0x24) = iVar9;
    }
  }
  local_50 = *(long *)(this + 8);
  local_60 = (long)iVar14;
  lVar7 = local_60 * 0x18;
  pcVar2 = (char *)(local_50 + lVar7);
  pPVar3 = *key;
  local_58 = this;
  Memory::Recycler::WBSetBit((char *)&local_48);
  local_48 = pPVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
  pIVar4 = *local_40;
  Memory::Recycler::WBSetBit((char *)&local_68);
  local_68 = pIVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
  pIVar4 = local_68;
  Memory::Recycler::WBSetBit(pcVar2);
  addr = (char *)((undefined8 *)(local_50 + lVar7) + 2);
  *(undefined8 *)(local_50 + lVar7) = pIVar4;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar2);
  pPVar3 = local_48;
  Memory::Recycler::WBSetBit(addr);
  *(PolymorphicInlineCache **)addr = pPVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  lVar11 = *(long *)local_58;
  lVar5 = *(long *)(local_58 + 8);
  *(undefined4 *)(lVar5 + 8 + lVar7) = *(undefined4 *)(lVar11 + (ulong)local_34 * 4);
  *(int *)(lVar11 + (ulong)local_34 * 4) = (int)local_60;
  uVar12 = 0;
  iVar9 = iVar14;
  do {
    iVar9 = *(int *)(lVar5 + 8 + (long)iVar9 * 0x18);
    uVar12 = uVar12 + 1;
  } while (iVar9 != -1);
  if (*(DictionaryStats **)(local_58 + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(*(DictionaryStats **)(local_58 + 0x30),uVar12);
  }
  return iVar14;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }